

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void ARGBAddRow_C(uint8_t *src_argb0,uint8_t *src_argb1,uint8_t *dst_argb,int width)

{
  undefined4 uVar1;
  undefined4 uVar2;
  long lVar3;
  ushort uVar4;
  ushort uVar5;
  ushort uVar6;
  ushort uVar7;
  
  if (0 < width) {
    lVar3 = 0;
    do {
      uVar1 = *(undefined4 *)(src_argb0 + lVar3 * 4);
      uVar2 = *(undefined4 *)(src_argb1 + lVar3 * 4);
      uVar4 = ((ushort)uVar2 & 0xff) + ((ushort)uVar1 & 0xff);
      uVar5 = (ushort)(byte)((uint)uVar2 >> 8) + (ushort)(byte)((uint)uVar1 >> 8);
      uVar6 = (ushort)(byte)((uint)uVar2 >> 0x10) + (ushort)(byte)((uint)uVar1 >> 0x10);
      uVar7 = (ushort)(byte)((uint)uVar2 >> 0x18) + (ushort)(byte)((uint)uVar1 >> 0x18);
      uVar4 = (ushort)(0xff < uVar4) * 0xff | (0xff >= uVar4) * uVar4;
      uVar5 = (ushort)(0xff < uVar5) * 0xff | (0xff >= uVar5) * uVar5;
      uVar6 = (ushort)(0xff < uVar6) * 0xff | (0xff >= uVar6) * uVar6;
      uVar7 = (ushort)(0xff < uVar7) * 0xff | (0xff >= uVar7) * uVar7;
      *(uint *)(dst_argb + lVar3 * 4) =
           CONCAT13((uVar7 != 0) * (uVar7 < 0x100) * (char)uVar7 - (0xff < uVar7),
                    CONCAT12((uVar6 != 0) * (uVar6 < 0x100) * (char)uVar6 - (0xff < uVar6),
                             CONCAT11((uVar5 != 0) * (uVar5 < 0x100) * (char)uVar5 - (0xff < uVar5),
                                      (uVar4 != 0) * (uVar4 < 0x100) * (char)uVar4 - (0xff < uVar4))
                            ));
      lVar3 = lVar3 + 1;
    } while (width != (int)lVar3);
  }
  return;
}

Assistant:

void ARGBAddRow_C(const uint8_t* src_argb0,
                  const uint8_t* src_argb1,
                  uint8_t* dst_argb,
                  int width) {
  int i;
  for (i = 0; i < width; ++i) {
    const int b = src_argb0[0];
    const int g = src_argb0[1];
    const int r = src_argb0[2];
    const int a = src_argb0[3];
    const int b_add = src_argb1[0];
    const int g_add = src_argb1[1];
    const int r_add = src_argb1[2];
    const int a_add = src_argb1[3];
    dst_argb[0] = SHADE(b, b_add);
    dst_argb[1] = SHADE(g, g_add);
    dst_argb[2] = SHADE(r, r_add);
    dst_argb[3] = SHADE(a, a_add);
    src_argb0 += 4;
    src_argb1 += 4;
    dst_argb += 4;
  }
}